

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::append_char(dynamic_string *this,char c)

{
  bool bVar1;
  char c_local;
  dynamic_string *this_local;
  
  bVar1 = ensure_buf(this,this->m_len + 1,true);
  if (bVar1) {
    this->m_pStr[this->m_len] = c;
    this->m_pStr[(int)(this->m_len + 1)] = '\0';
    this->m_len = this->m_len + 1;
    check(this);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::append_char(char c)
    {
        if (ensure_buf(m_len + 1))
        {
            m_pStr[m_len] = c;
            m_pStr[m_len + 1] = '\0';
            m_len++;
            check();
        }

        return *this;
    }